

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void leveldb::_Test_Recovery::_RunIt(void)

{
  undefined1 local_b0 [8];
  _Test_Recovery t;
  
  _Test_Recovery((_Test_Recovery *)local_b0);
  _Run((_Test_Recovery *)local_b0);
  ~_Test_Recovery((_Test_Recovery *)local_b0);
  return;
}

Assistant:

TEST(CorruptionTest, Recovery) {
  Build(100);
  Check(100, 100);
  Corrupt(kLogFile, 19, 1);  // WriteBatch tag for first record
  Corrupt(kLogFile, log::kBlockSize + 1000, 1);  // Somewhere in second block
  Reopen();

  // The 64 records in the first two log blocks are completely lost.
  Check(36, 36);
}